

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O1

void list_object(chunk_conflict *c,object *obj)

{
  size_t len;
  ushort uVar1;
  ushort uVar2;
  chunk_conflict2 *pcVar3;
  object **ppoVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (obj != (object *)0x0) {
    uVar6 = (ulong)c->obj_max;
    if (1 < uVar6) {
      uVar7 = 1;
      do {
        if (c->objects[uVar7] == obj) {
          return;
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    if (1 < c->obj_max) {
      uVar7 = 1;
      do {
        if ((((cave != c) || (player->cave == (chunk_conflict2 *)0x0)) ||
            (player->cave->objects[uVar7] == (object *)0x0)) && (c->objects[uVar7] == (object *)0x0)
           ) {
          c->objects[uVar7] = obj;
          obj->oidx = (uint16_t)uVar7;
          return;
        }
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    len = uVar6 * 8 + 0x408;
    ppoVar4 = (object **)mem_realloc(c->objects,len);
    c->objects = ppoVar4;
    uVar1 = c->obj_max;
    *(object **)((long)ppoVar4 + (ulong)((uint)uVar1 * 8)) = obj;
    obj->oidx = uVar1;
    lVar5 = 0;
    do {
      *(undefined8 *)((long)c->objects + lVar5 * 8 + (ulong)((uint)uVar1 * 8) + 8) = 0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x80);
    c->obj_max = uVar1 + 0x80;
    if ((cave == c) && (player->cave != (chunk_conflict2 *)0x0)) {
      ppoVar4 = (object **)mem_realloc(player->cave->objects,len);
      pcVar3 = player->cave;
      pcVar3->objects = ppoVar4;
      uVar1 = pcVar3->obj_max;
      uVar6 = (ulong)uVar1;
      uVar2 = c->obj_max;
      if (uVar1 <= uVar2) {
        do {
          player->cave->objects[uVar6] = (object *)0x0;
          uVar6 = uVar6 + 1;
        } while ((ulong)uVar2 + 1 != uVar6);
      }
      player->cave->obj_max = uVar2;
    }
  }
  return;
}

Assistant:

void list_object(struct chunk *c, struct object *obj)
{
	int i, newsize;

	/* Check for duplicates and objects already deleted or combined */
	if (!obj) return;
	for (i = 1; i < c->obj_max; i++)
		if (c->objects[i] == obj)
			return;

	/* Put objects in holes in the object list */
	for (i = 1; i < c->obj_max; i++) {
		/* If there is a known object, skip this slot */
		if ((c == cave) && player->cave && player->cave->objects[i]) {
			continue;
		}

		/* Put the object in a hole */
		if (c->objects[i] == NULL) {
			c->objects[i] = obj;
			obj->oidx = i;
			return;
		}
	}

	/* Extend the list */
	newsize = (c->obj_max + OBJECT_LIST_INCR + 1) * sizeof(struct object*);
	c->objects = mem_realloc(c->objects, newsize);
	c->objects[c->obj_max] = obj;
	obj->oidx = c->obj_max;
	for (i = c->obj_max + 1; i <= c->obj_max + OBJECT_LIST_INCR; i++)
		c->objects[i] = NULL;
	c->obj_max += OBJECT_LIST_INCR;

	/* If we're on the current level, extend the known list */
	if ((c == cave) && player->cave) {
		player->cave->objects = mem_realloc(player->cave->objects, newsize);
		for (i = player->cave->obj_max; i <= c->obj_max; i++)
			player->cave->objects[i] = NULL;
		player->cave->obj_max = c->obj_max;
	}
}